

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::get_common_basic_type(Compiler *this,SPIRType *type,BaseType *base_type)

{
  BaseType BVar1;
  TypedID<(spirv_cross::Types)1> *pTVar2;
  size_t sVar3;
  bool bVar4;
  undefined8 in_RAX;
  SPIRType *type_00;
  long lVar5;
  BaseType member_base;
  undefined8 uStack_38;
  
  BVar1 = *(BaseType *)&(type->super_IVariant).field_0xc;
  if (BVar1 == Struct) {
    *base_type = Unknown;
    pTVar2 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
    ;
    sVar3 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    uStack_38 = in_RAX;
    for (lVar5 = 0; sVar3 << 2 != lVar5; lVar5 = lVar5 + 4) {
      type_00 = get<spirv_cross::SPIRType>(this,*(uint32_t *)((long)&pTVar2->id + lVar5));
      bVar4 = get_common_basic_type(this,type_00,(BaseType *)((long)&uStack_38 + 4));
      if (!bVar4) {
        return false;
      }
      if (*base_type == Unknown) {
        *base_type = uStack_38._4_4_;
      }
      else if (*base_type != uStack_38._4_4_) {
        return false;
      }
    }
  }
  else {
    *base_type = BVar1;
  }
  return true;
}

Assistant:

bool Compiler::get_common_basic_type(const SPIRType &type, SPIRType::BaseType &base_type)
{
	if (type.basetype == SPIRType::Struct)
	{
		base_type = SPIRType::Unknown;
		for (auto &member_type : type.member_types)
		{
			SPIRType::BaseType member_base;
			if (!get_common_basic_type(get<SPIRType>(member_type), member_base))
				return false;

			if (base_type == SPIRType::Unknown)
				base_type = member_base;
			else if (base_type != member_base)
				return false;
		}
		return true;
	}
	else
	{
		base_type = type.basetype;
		return true;
	}
}